

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::FunctionMockerBase<test_result_(unsigned_long_long)>::PerformDefaultAction
          (FunctionMockerBase<test_result_(unsigned_long_long)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<test_result_(unsigned_long_long)> *this_00;
  pointer pcVar1;
  bool bVar2;
  Action<test_result_(unsigned_long_long)> *this_01;
  runtime_error *this_02;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string message;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00135d18;
    this_00 = (OnCallSpec<test_result_(unsigned_long_long)> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<test_result_(unsigned_long_long)>::Matches(this_00,args);
  } while (!bVar2);
  if (this_00 != (OnCallSpec<test_result_(unsigned_long_long)> *)0x0) {
    this_01 = OnCallSpec<test_result_(unsigned_long_long)>::GetAction(this_00);
    Action<test_result_(unsigned_long_long)>::Perform(this_01,args);
    return;
  }
LAB_00135d18:
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_48);
  if (DefaultValue<test_result>::value_ != 0) {
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)local_48);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }